

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall ON_Xform::IsValidAndNotZeroAndNotIdentity(ON_Xform *this,double zero_tolerance)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  bVar2 = IsValid(this);
  if (bVar2) {
    bVar2 = false;
    if ((0.0 <= zero_tolerance) && (bVar2 = false, zero_tolerance < 1.23432101234321e+308)) {
      iVar4 = 0;
      iVar3 = 0;
      for (lVar5 = 0; (int)lVar5 != 0x78; lVar5 = lVar5 + 0x28) {
        dVar1 = *(double *)((long)this->m_xform[0] + lVar5);
        if (ABS(1.0 - dVar1) <= zero_tolerance) {
          if (0 < iVar3) {
            return true;
          }
          iVar4 = iVar4 + 1;
        }
        else {
          if (zero_tolerance < ABS(dVar1)) {
            return true;
          }
          if (0 < iVar4) {
            return true;
          }
          iVar3 = iVar3 + 1;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar5 + 8))) {
          return true;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar5 + 0x10))) {
          return true;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar5 + 0x18))) {
          return true;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[1] + lVar5))) {
          return true;
        }
      }
      bVar2 = true;
      if (ABS(1.0 - this->m_xform[3][3]) <= zero_tolerance) {
        bVar2 = iVar3 != 3 && iVar4 != 3;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_Xform::IsValidAndNotZeroAndNotIdentity(
  double zero_tolerance
) const
{
  if (false == IsValid())
    return false;

  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  int one_count = 0;
  int zero_count = 0;
  const double* v = &m_xform[0][0];
  for ( int i = 0; i < 3; i++ )
  {
    if (fabs(1.0 - *v) <= zero_tolerance)
    {
      // this diagonal coefficient = 1
      one_count++;
      if (zero_count > 0)
        return true;
    }
    else if (fabs(*v) <= zero_tolerance)
    {
      // this diagonal coefficient = 0
      zero_count++;
      if (one_count > 0)
        return true;
    }
    else
    {
      // this diagonal coefficient != 1 and != 0
      return true;
    }

    // If any off diagonal coefficient is not zero, return true
    v++;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
  }

  if (!(fabs(1.0 - *v) <= zero_tolerance))
  {
    if (3 == zero_count && fabs(1.0 - *v) <= zero_tolerance)
      return false; // every matrix coefficient = 0

    // otherwise, xform[3][3] != 1 so return true.
    return true;
  }

  if (3 == one_count || 3 == zero_count)
    return false;

  return true;
}